

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricer_test.cc
# Opt level: O3

void __thiscall
fizplex::PricerTestTwoVars_NegCostAtLowerIsNotOptimal_Test::TestBody
          (PricerTestTwoVars_NegCostAtLowerIsNotOptimal_Test *this)

{
  bool bVar1;
  char *message;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *non_basic_indices;
  initializer_list<double> l;
  initializer_list<double> l_00;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  DVector d;
  DVector x;
  Candidate candidate;
  AssertHelper local_98;
  Message local_90;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  AssertHelper local_80;
  string local_78;
  DVector local_58;
  DVector local_40;
  Candidate local_28;
  
  local_78._M_dataplus._M_p = &DAT_3ff0000000000000;
  local_78._M_string_length = (size_type)&DAT_bff0000000000000;
  l._M_len = 2;
  l._M_array = (iterator)&local_78;
  DVector::DVector(&local_40,l);
  local_78._M_dataplus._M_p = (char *)0x0;
  local_78._M_string_length = (size_type)&DAT_bff0000000000000;
  l_00._M_len = 2;
  l_00._M_array = (iterator)&local_78;
  DVector::DVector(&local_58,l_00);
  non_basic_indices = &(this->super_PricerTestTwoVars).nbi;
  Pricer::price(&local_28,(Pricer *)&(this->super_PricerTestTwoVars).field_0xb0,&local_40,
                &(this->super_PricerTestTwoVars).lp,&local_58,non_basic_indices);
  local_90.ss_.ptr_._0_4_ = CONCAT31(local_90.ss_.ptr_._1_3_,local_28.is_optimal) ^ 1;
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28.is_optimal != false) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)&local_90,(AssertionResult *)"candidate.is_optimal","true",
               "false",(char *)non_basic_indices);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/pricer_test.cc"
               ,0x1b,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_98.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_98.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90.ss_.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&local_78,"candidate.index","1u",&local_28.index,(uint *)&local_90);
  if ((char)local_78._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_90);
    if ((undefined8 *)local_78._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_78._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/pricer_test.cc"
               ,0x1c,message);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (CONCAT44(local_90.ss_.ptr_._4_4_,(uint)local_90.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_90.ss_.ptr_._4_4_,(uint)local_90.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_90.ss_.ptr_._4_4_,(uint)local_90.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  operator_delete(local_58.vals._M_data);
  operator_delete(local_40.vals._M_data);
  return;
}

Assistant:

TEST_F(PricerTestTwoVars, NegCostAtLowerIsNotOptimal) {
  DVector x = {1.0, -1.0};
  DVector d = {0.0, -1.0};
  const auto candidate = p.price(x, lp, d, nbi);
  EXPECT_FALSE(candidate.is_optimal);
  EXPECT_EQ(candidate.index, 1u);
}